

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall jessilib::thread_pool::push(thread_pool *this,task_t *in_task)

{
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> guard;
  thread *target_thread;
  task_t *in_task_local;
  thread_pool *this_local;
  
  guard._M_device = (mutex_type *)inactive_thread(this);
  if ((thread *)guard._M_device == (thread *)0x0) {
    std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_tasks_mutex);
    std::
    queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::push(&this->m_tasks,in_task);
    std::lock_guard<std::mutex>::~lock_guard(&local_28);
  }
  else {
    std::function<void_()>::operator=(&((thread *)guard._M_device)->m_task,in_task);
    std::condition_variable::notify_one();
  }
  return;
}

Assistant:

void thread_pool::push(task_t in_task) {
	thread* target_thread = inactive_thread();

	if (target_thread != nullptr) {
		target_thread->m_task = in_task;
		target_thread->m_notifier.notify_one();
	}
	else {
		std::lock_guard<std::mutex> guard(m_tasks_mutex);
		m_tasks.push(in_task);
	}
}